

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O2

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::reassign
          (WorkData *this,uint32_t varId,uint32_t newId,uint32_t oldId)

{
  int line;
  bool bVar1;
  char *msg;
  
  bVar1 = isAssigned(this,oldId);
  if (bVar1) {
    bVar1 = isAssigned(this,newId);
    if (bVar1) {
      msg = "!isAssigned(newId)";
      line = 0x7d;
    }
    else if (this->_physToVarId[oldId] == varId) {
      if (this->_physToVarId[newId] == 0xff) {
        this->_physToVarId[oldId] = 0xff;
        this->_physToVarId[newId] = (uint8_t)varId;
        this->_assignedRegs = this->_assignedRegs ^ 1 << ((byte)oldId & 0x1f) ^ 1 << (newId & 0x1f);
        return;
      }
      msg = "_physToVarId[newId] == kVarIdNone";
      line = 0x7f;
    }
    else {
      msg = "_physToVarId[oldId] == varId";
      line = 0x7e;
    }
  }
  else {
    msg = "isAssigned(oldId)";
    line = 0x7c;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/funcargscontext_p.h"
             ,line,msg);
}

Assistant:

inline void reassign(uint32_t varId, uint32_t newId, uint32_t oldId) noexcept {
      ASMJIT_ASSERT( isAssigned(oldId));
      ASMJIT_ASSERT(!isAssigned(newId));
      ASMJIT_ASSERT(_physToVarId[oldId] == varId);
      ASMJIT_ASSERT(_physToVarId[newId] == kVarIdNone);

      _physToVarId[oldId] = uint8_t(kVarIdNone);
      _physToVarId[newId] = uint8_t(varId);
      _assignedRegs ^= Support::bitMask(newId) ^ Support::bitMask(oldId);
    }